

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O3

void checkered_spheres(void)

{
  shared_ptr<checker_texture> checker;
  undefined1 local_24d;
  int local_24c;
  shared_ptr<lambertian> local_248;
  vec3 local_238;
  shared_ptr<checker_texture> local_218;
  shared_ptr<hittable> local_208;
  shared_ptr<hittable> local_1f8;
  hittable_list local_1e8;
  undefined1 local_198 [16];
  double local_188;
  double local_180;
  double dStack_178;
  double local_170;
  double dStack_168;
  double local_160;
  double dStack_158;
  double local_150;
  double local_148;
  double dStack_140;
  double local_138;
  double dStack_130;
  double local_128;
  double local_120;
  double dStack_118;
  double local_110;
  undefined1 local_f8 [224];
  
  local_1e8.super_hittable._vptr_hittable = (_func_int **)&PTR__hittable_list_001283e8;
  local_1e8.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  local_1e8.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1e8.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1e8.bbox.x.min = INFINITY;
  local_1e8.bbox.x.max = -INFINITY;
  local_1e8.bbox.y.min = INFINITY;
  local_1e8.bbox.y.max = -INFINITY;
  local_1e8.bbox.z.min = INFINITY;
  local_1e8.bbox.z.max = -INFINITY;
  local_248.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x3fd47ae147ae147b;
  local_198._0_8_ = 0.2;
  local_198._8_8_ = 0.3;
  local_188 = 0.1;
  local_238.e[0] = 0.9;
  local_238.e[1] = 0.9;
  local_238.e[2] = 0.9;
  local_218.super___shared_ptr<checker_texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<checker_texture,std::allocator<checker_texture>,double,vec3,vec3>
            (&local_218.super___shared_ptr<checker_texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (checker_texture **)&local_218,(allocator<checker_texture> *)&local_24c,
             (double *)&local_248,(vec3 *)local_198,&local_238);
  local_198._0_8_ = 0.0;
  local_198._8_8_ = -10.0;
  local_188 = 0.0;
  local_24c = 10;
  local_248.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<lambertian,std::allocator<lambertian>,std::shared_ptr<checker_texture>&>
            (&local_248.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (lambertian **)&local_248,(allocator<lambertian> *)&local_24d,&local_218);
  local_238.e[0] = 0.0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<sphere,std::allocator<sphere>,vec3,int,std::shared_ptr<lambertian>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_238.e + 1),(sphere **)&local_238,
             (allocator<sphere> *)&local_24d,(vec3 *)local_198,&local_24c,&local_248);
  local_1f8.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_238.e[0];
  local_1f8.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238.e[1];
  local_238.e[0] = 0.0;
  local_238.e[1] = 0.0;
  hittable_list::add(&local_1e8,&local_1f8);
  if (local_1f8.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1f8.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ;
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238.e[1] !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238.e[1]);
  }
  if (local_248.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_248.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  local_198._0_8_ = 0.0;
  local_198._8_8_ = 10.0;
  local_188 = 0.0;
  local_24c = 10;
  local_248.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<lambertian,std::allocator<lambertian>,std::shared_ptr<checker_texture>&>
            (&local_248.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (lambertian **)&local_248,(allocator<lambertian> *)&local_24d,&local_218);
  local_238.e[0] = 0.0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<sphere,std::allocator<sphere>,vec3,int,std::shared_ptr<lambertian>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_238.e + 1),(sphere **)&local_238,
             (allocator<sphere> *)&local_24d,(vec3 *)local_198,&local_24c,&local_248);
  local_208.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_238.e[0];
  local_208.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238.e[1];
  local_238.e[0] = 0.0;
  local_238.e[1] = 0.0;
  hittable_list::add(&local_1e8,&local_208);
  if (local_208.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_208.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ;
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238.e[1] !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238.e[1]);
  }
  if (local_248.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_248.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  local_110 = 10.0;
  memset(local_f8,0,0xd8);
  local_198._0_8_ = 1.7777777777777777;
  local_198._8_8_ = 2.12199579294153e-312;
  local_188 = (double)CONCAT44(local_188._4_4_,0x32);
  local_180 = 0.7;
  dStack_178 = 0.8;
  local_170 = 1.0;
  dStack_168 = 20.0;
  local_160 = 13.0;
  dStack_158 = 2.0;
  local_150 = 3.0;
  local_148 = 0.0;
  dStack_140 = 0.0;
  local_138 = 0.0;
  dStack_130 = 0.0;
  local_128 = 1.0;
  local_120 = 0.0;
  dStack_118 = 0.0;
  camera::render((camera *)local_198,&local_1e8.super_hittable);
  if (local_218.super___shared_ptr<checker_texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_218.super___shared_ptr<checker_texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  local_1e8.super_hittable._vptr_hittable = (_func_int **)&PTR__hittable_list_001283e8;
  std::vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>::~vector
            (&local_1e8.objects);
  return;
}

Assistant:

void bouncing_spheres() {
    hittable_list world;

    auto checker = make_shared<checker_texture>(0.32, color(.2, .3, .1), color(.9, .9, .9));
    world.add(make_shared<sphere>(point3(0,-1000,0), 1000, make_shared<lambertian>(checker)));

    for (int a = -11; a < 11; a++) {
        for (int b = -11; b < 11; b++) {
            auto choose_mat = random_double();
            point3 center(a + 0.9*random_double(), 0.2, b + 0.9*random_double());

            if ((center - point3(4, 0.2, 0)).length() > 0.9) {
                shared_ptr<material> sphere_material;

                if (choose_mat < 0.8) {
                    // diffuse
                    auto albedo = color::random() * color::random();
                    sphere_material = make_shared<lambertian>(albedo);
                    auto center2 = center + vec3(0, random_double(0,.5), 0);
                    world.add(make_shared<sphere>(center, center2, 0.2, sphere_material));
                } else if (choose_mat < 0.95) {
                    // metal
                    auto albedo = color::random(0.5, 1);
                    auto fuzz = random_double(0, 0.5);
                    sphere_material = make_shared<metal>(albedo, fuzz);
                    world.add(make_shared<sphere>(center, 0.2, sphere_material));
                } else {
                    // glass
                    sphere_material = make_shared<dielectric>(1.5);
                    world.add(make_shared<sphere>(center, 0.2, sphere_material));
                }
            }
        }
    }

    auto material1 = make_shared<dielectric>(1.5);
    world.add(make_shared<sphere>(point3(0, 1, 0), 1.0, material1));

    auto material2 = make_shared<lambertian>(color(0.4, 0.2, 0.1));
    world.add(make_shared<sphere>(point3(-4, 1, 0), 1.0, material2));

    auto material3 = make_shared<metal>(color(0.7, 0.6, 0.5), 0.0);
    world.add(make_shared<sphere>(point3(4, 1, 0), 1.0, material3));

    world = hittable_list(make_shared<bvh_node>(world));

    camera cam;

    cam.aspect_ratio      = 16.0 / 9.0;
    cam.image_width       = 400;
    cam.samples_per_pixel = 100;
    cam.max_depth         = 50;
    cam.background        = color(0.70, 0.80, 1.00);

    cam.vfov     = 20;
    cam.lookfrom = point3(13,2,3);
    cam.lookat   = point3(0,0,0);
    cam.vup      = vec3(0,1,0);

    cam.defocus_angle = 0.6;
    cam.focus_dist    = 10.0;

    cam.render(world);
}